

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::V0LayerParameter::SerializeWithCachedSizes(V0LayerParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  int iVar4;
  float fVar5;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.name");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output)
    ;
  }
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.type");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,(this->type_).ptr_,output)
    ;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(3,this->num_output_,output);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(4,this->biasterm_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (5,(MessageLite *)this->weight_filler_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (6,(MessageLite *)this->bias_filler_,output);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(7,this->pad_,output);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(8,this->kernelsize_,output);
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(9,this->group_,output);
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,this->stride_,output);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0xb,this->pool_,output);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0xc,this->dropout_ratio_,output);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xd,this->local_size_,output);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0xe,this->alpha_,output);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0xf,this->beta_,output);
  }
  if ((uVar1 & 4) != 0) {
    psVar3 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.source");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x10,(this->source_).ptr_,output);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x11,this->scale_,output);
  }
  if ((uVar1 & 8) != 0) {
    psVar3 = (this->meanfile_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.meanfile");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x12,(this->meanfile_).ptr_,output);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x13,this->batchsize_,output);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x14,this->cropsize_,output);
  }
  if ((short)uVar1 < 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x15,this->mirror_,output);
  }
  if ((int)uVar1 < 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x16,this->k_,output);
  }
  iVar2 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar4 = 0; iVar2 != iVar4; iVar4 = iVar4 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&(this->blobs_).super_RepeatedPtrFieldBase,iVar4);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x32,(MessageLite *)value,output);
  }
  iVar2 = (this->blobs_lr_).current_size_;
  iVar4 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar4;
  }
  for (; iVar2 != iVar4; iVar4 = iVar4 + 1) {
    fVar5 = blobs_lr(this,iVar4);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x33,fVar5,output);
  }
  iVar2 = (this->weight_decay_).current_size_;
  iVar4 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar4;
  }
  for (; iVar2 != iVar4; iVar4 = iVar4 + 1) {
    fVar5 = weight_decay(this,iVar4);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x34,fVar5,output);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x35,this->rand_skip_,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x36,this->det_fg_threshold_,output);
  }
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x37,this->det_bg_threshold_,output);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(0x38,this->det_fg_fraction_,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 >> 0x12 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x3a,this->det_context_pad_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    psVar3 = (this->det_crop_mode_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.det_crop_mode");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x3b,(this->det_crop_mode_).ptr_,output);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3c,this->new_num_,output);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3d,this->new_channels_,output);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3e,this->new_height_,output);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3f,this->new_width_,output);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x40,this->shuffle_images_,output);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x41,this->concat_dim_,output);
  }
  if ((char)uVar1 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x3e9,(MessageLite *)this->hdf5_output_param_,output);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = V0LayerParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
    return;
  }
  return;
}

Assistant:

void V0LayerParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.V0LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->type(), output);
  }

  // optional uint32 num_output = 3;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(3, this->num_output(), output);
  }

  // optional bool biasterm = 4 [default = true];
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(4, this->biasterm(), output);
  }

  // optional .caffe.FillerParameter weight_filler = 5;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, *this->weight_filler_, output);
  }

  // optional .caffe.FillerParameter bias_filler = 6;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, *this->bias_filler_, output);
  }

  // optional uint32 pad = 7 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(7, this->pad(), output);
  }

  // optional uint32 kernelsize = 8;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(8, this->kernelsize(), output);
  }

  // optional uint32 group = 9 [default = 1];
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(9, this->group(), output);
  }

  // optional uint32 stride = 10 [default = 1];
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->stride(), output);
  }

  // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      11, this->pool(), output);
  }

  // optional float dropout_ratio = 12 [default = 0.5];
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(12, this->dropout_ratio(), output);
  }

  // optional uint32 local_size = 13 [default = 5];
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(13, this->local_size(), output);
  }

  // optional float alpha = 14 [default = 1];
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(14, this->alpha(), output);
  }

  // optional float beta = 15 [default = 0.75];
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(15, this->beta(), output);
  }

  // optional string source = 16;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      16, this->source(), output);
  }

  // optional float scale = 17 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(17, this->scale(), output);
  }

  // optional string meanfile = 18;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->meanfile().data(), this->meanfile().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.meanfile");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      18, this->meanfile(), output);
  }

  // optional uint32 batchsize = 19;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(19, this->batchsize(), output);
  }

  // optional uint32 cropsize = 20 [default = 0];
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(20, this->cropsize(), output);
  }

  // optional bool mirror = 21 [default = false];
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(21, this->mirror(), output);
  }

  // optional float k = 22 [default = 1];
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(22, this->k(), output);
  }

  // repeated .caffe.BlobProto blobs = 50;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      50, this->blobs(i), output);
  }

  // repeated float blobs_lr = 51;
  for (int i = 0, n = this->blobs_lr_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      51, this->blobs_lr(i), output);
  }

  // repeated float weight_decay = 52;
  for (int i = 0, n = this->weight_decay_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      52, this->weight_decay(i), output);
  }

  // optional uint32 rand_skip = 53 [default = 0];
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(53, this->rand_skip(), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional float det_fg_threshold = 54 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(54, this->det_fg_threshold(), output);
  }

  // optional float det_bg_threshold = 55 [default = 0.5];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(55, this->det_bg_threshold(), output);
  }

  // optional float det_fg_fraction = 56 [default = 0.25];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(56, this->det_fg_fraction(), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional uint32 det_context_pad = 58 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(58, this->det_context_pad(), output);
  }

  // optional string det_crop_mode = 59 [default = "warp"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->det_crop_mode().data(), this->det_crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.det_crop_mode");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      59, this->det_crop_mode(), output);
  }

  // optional int32 new_num = 60 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(60, this->new_num(), output);
  }

  // optional int32 new_channels = 61 [default = 0];
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(61, this->new_channels(), output);
  }

  // optional int32 new_height = 62 [default = 0];
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(62, this->new_height(), output);
  }

  // optional int32 new_width = 63 [default = 0];
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(63, this->new_width(), output);
  }

  // optional bool shuffle_images = 64 [default = false];
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(64, this->shuffle_images(), output);
  }

  // optional uint32 concat_dim = 65 [default = 1];
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(65, this->concat_dim(), output);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1001, *this->hdf5_output_param_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.V0LayerParameter)
}